

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::find<int>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *this,key_arg<int> *key)

{
  ulong uVar1;
  iterator iVar2;
  
  AssertNotDebugCapacity(this);
  uVar1 = ((ulong)(uint)*key ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13;
  iVar2 = find_non_soo<int>(this,key,uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                                     (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8
                                     | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                                     (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
  return iVar2;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }